

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinLineStipplePattern::emulate_mthd(MthdKelvinLineStipplePattern *this)

{
  MthdKelvinLineStipplePattern *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  pgraph_kelvin_check_err18(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_line_stipple =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_line_stipple &
         0xffff00ff | ((this->super_SingleMthdTest).super_MthdTest.val & 0xff) << 8;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_line_stipple =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_line_stipple &
         0xffff | (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) >> 0x30)
                        << 0x10);
    pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x18,0,
                  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                  bundle_line_stipple,true);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			insrt(exp.bundle_line_stipple, 8, 8, extr(val, 0, 8));
			insrt(exp.bundle_line_stipple, 16, 16, extr(val, 16, 16));
			pgraph_bundle(&exp, BUNDLE_LINE_STIPPLE, 0, exp.bundle_line_stipple, true);
		}
	}